

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_white_noise
          (rf_image *__return_storage_ptr__,int width,int height,float factor,rf_rand_proc rand,
          rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_allocator_args rVar2;
  undefined1 auVar3 [16];
  rf_color *dst;
  uint uVar4;
  uint uStack_54;
  rf_allocator local_38;
  
  local_38.allocator_proc = allocator.allocator_proc;
  local_38.user_data = allocator.user_data;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (0 < height * width && rand != (rf_rand_proc)0x0) {
    uVar4 = height * width * 4;
    rVar1.proc_name = "rf_gen_image_white_noise";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x4282;
    auVar3 = ZEXT416(uVar4) << 0x40;
    rVar2._16_8_ = (ulong)uStack_54 << 0x20;
    rVar2.pointer_to_free_or_realloc = (void *)auVar3._0_8_;
    rVar2.size_to_allocate_or_reallocate = auVar3._8_8_;
    dst = (rf_color *)(*local_38.allocator_proc)(&local_38,rVar1,RF_AM_ALLOC,rVar2);
    rf_gen_image_white_noise_to_buffer
              (__return_storage_ptr__,width,height,factor,rand,dst,(ulong)uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_white_noise(int width, int height, float factor, rf_rand_proc rand, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);

    if (!rand || dst_size <= 0) return result;

    rf_color* dst = RF_ALLOC(allocator, dst_size);
    result = rf_gen_image_white_noise_to_buffer(width, height, factor, rand, dst, dst_size);

    return result;
}